

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

void __thiscall slang::parsing::NumberParser::reportIntOverflow(NumberParser *this,Token token)

{
  SourceLocation this_00;
  Diagnostic *arg;
  SourceLocation in_RDI;
  SVInt val;
  SVInt *this_01;
  SVInt *in_stack_ffffffffffffff88;
  SVInt local_38;
  SVInt local_28;
  Token local_10;
  
  this_01 = &local_38;
  Token::intValue((Token *)in_RDI);
  SVInt::resize(in_stack_ffffffffffffff88,(bitwidth_t)((ulong)this_01 >> 0x20));
  SVInt::~SVInt(this_01);
  SVInt::setSigned(&local_28,true);
  this_00 = Token::location(&local_10);
  arg = addDiag((NumberParser *)this_00,SUB84((ulong)this_01 >> 0x20,0),in_RDI);
  slang::ConstantValue::ConstantValue((ConstantValue *)this_00,(SVInt *)arg);
  Diagnostic::operator<<((Diagnostic *)this_00,(ConstantValue *)arg);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa90aae);
  SVInt::~SVInt(this_01);
  return;
}

Assistant:

void NumberParser::reportIntOverflow(Token token) {
    SVInt val = token.intValue().resize(32);
    val.setSigned(true);

    addDiag(diag::SignedIntegerOverflow, token.location()) << val;
}